

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collator.cpp
# Opt level: O1

Collator * __thiscall
booster::locale::impl_icu::collate_impl<wchar_t>::get_collator
          (collate_impl<wchar_t> *this,level_type ilevel)

{
  level_type lVar1;
  int iVar2;
  undefined4 extraout_var;
  Collator *pCVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  runtime_error *this_00;
  long *plVar4;
  size_type *psVar5;
  thread_specific_ptr<icu_70::Collator> *this_01;
  ulong uVar6;
  UErrorCode status;
  UErrorCode local_6c;
  string local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  lVar1 = identical;
  if ((int)ilevel < 4) {
    lVar1 = ilevel;
  }
  uVar6 = 0;
  if (0 < (int)lVar1) {
    uVar6 = (ulong)lVar1;
  }
  iVar2 = (*((this->collates_[uVar6].key_.p_)->super_refcounted)._vptr_refcounted[2])();
  pCVar3 = *(Collator **)(CONCAT44(extraout_var,iVar2) + 8);
  if (pCVar3 == (Collator *)0x0) {
    this_01 = this->collates_ + uVar6;
    local_6c = U_ZERO_ERROR;
    pCVar3 = (Collator *)icu_70::Collator::createInstance(&this->locale_,&local_6c);
    thread_specific_ptr<icu_70::Collator>::reset(this_01,pCVar3);
    if (U_ZERO_ERROR < local_6c) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,"Creation of collate failed:","");
      u_errorName_70(local_6c);
      plVar4 = (long *)std::__cxx11::string::append((char *)local_48);
      local_68._M_dataplus._M_p = (pointer)*plVar4;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_68._M_dataplus._M_p == psVar5) {
        local_68.field_2._M_allocated_capacity = *psVar5;
        local_68.field_2._8_8_ = plVar4[3];
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      }
      else {
        local_68.field_2._M_allocated_capacity = *psVar5;
      }
      local_68._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      runtime_error::runtime_error(this_00,&local_68);
      __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    iVar2 = (*(((this_01->key_).p_)->super_refcounted)._vptr_refcounted[2])();
    plVar4 = *(long **)(CONCAT44(extraout_var_00,iVar2) + 8);
    (**(code **)(*plVar4 + 0x98))(plVar4,get_collator::levels[uVar6]);
    iVar2 = (*(((this_01->key_).p_)->super_refcounted)._vptr_refcounted[2])();
    pCVar3 = *(Collator **)(CONCAT44(extraout_var_01,iVar2) + 8);
  }
  return pCVar3;
}

Assistant:

icu::Collator *get_collator(level_type ilevel) const
                {
                    int l = limit(ilevel);
                    static const icu::Collator::ECollationStrength levels[level_count] = 
                    { 
                        icu::Collator::PRIMARY,
                        icu::Collator::SECONDARY,
                        icu::Collator::TERTIARY,
                        icu::Collator::QUATERNARY,
                        icu::Collator::IDENTICAL
                    };
                    
                    icu::Collator *col = collates_[l].get();
                    if(col)
                        return col;

                    UErrorCode status=U_ZERO_ERROR;

                    collates_[l].reset(icu::Collator::createInstance(locale_,status));

                    if(U_FAILURE(status))
                        throw booster::runtime_error(std::string("Creation of collate failed:") + u_errorName(status));

                    collates_[l]->setStrength(levels[l]);
                    return collates_[l].get();
                }